

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# configreader.cpp
# Opt level: O2

bool __thiscall ConfigReader::parseGrid(ConfigReader *this)

{
  token_t tVar1;
  bool bVar2;
  string g;
  string tokstr;
  allocator<char> local_79;
  string local_78;
  string local_58;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  local_38._M_string_length = 0;
  local_38.field_2._M_local_buf[0] = '\0';
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  tVar1 = tokenize(this,&local_58);
  if (tVar1 == TOK_NUMBER) {
    tVar1 = tokenize(this,&local_38);
    if (tVar1 == TOK_SEMICOL) {
      std::__cxx11::stod(&local_58,(size_t *)0x0);
      bVar2 = true;
      (*this->_vptr_ConfigReader[5])(this);
      goto LAB_001246ba;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,"Expected ;\n",&local_79)
    ;
    error(this,&local_78);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"Expected a number for grid spacing\n",&local_79);
    error(this,&local_78);
  }
  std::__cxx11::string::~string((string *)&local_78);
  bVar2 = false;
LAB_001246ba:
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_38);
  return bVar2;
}

Assistant:

bool ConfigReader::parseGrid()
{
    // GRID: g 
    std::string tokstr;
    std::string g;

    // grid
    ConfigReader::token_t tok = tokenize(g);
    if (tok != TOK_NUMBER)
    {
        error("Expected a number for grid spacing\n");
        return false;
    }

    // expect semicol
    tok = tokenize(tokstr);
    if (tok != TOK_SEMICOL)
    {
        error("Expected ;\n");
        return false;
    }

    double gd;
    try
    {
        gd = std::stod(g);
    }
    catch(const std::invalid_argument& ia)
    {
        error(ia.what());
    }

    onGrid(gd);
    return true;
}